

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O0

void __thiscall xray_re::xr_vbuf::proxy(xr_vbuf *this,xr_vbuf *that,size_t base,size_t n)

{
  size_t sVar1;
  finfluence *local_68;
  fcolor *local_60;
  fvector2 *local_58;
  fvector2 *local_50;
  fvector3 *local_48;
  fvector3 *local_40;
  size_t n_local;
  size_t base_local;
  xr_vbuf *that_local;
  xr_vbuf *this_local;
  
  sVar1 = xr_flexbuf::size(&that->super_xr_flexbuf);
  if (base + n <= sVar1) {
    clear(this);
    xr_flexbuf::set_owner(&this->super_xr_flexbuf,false);
    xr_flexbuf::set_size(&this->super_xr_flexbuf,n);
    if (that->m_points == (fvector3 *)0x0) {
      local_40 = (fvector3 *)0x0;
    }
    else {
      local_40 = that->m_points + base;
    }
    this->m_points = local_40;
    if (that->m_normals == (fvector3 *)0x0) {
      local_48 = (fvector3 *)0x0;
    }
    else {
      local_48 = that->m_normals + base;
    }
    this->m_normals = local_48;
    if (that->m_texcoords == (fvector2 *)0x0) {
      local_50 = (fvector2 *)0x0;
    }
    else {
      local_50 = that->m_texcoords + base;
    }
    this->m_texcoords = local_50;
    if (that->m_lightmaps == (fvector2 *)0x0) {
      local_58 = (fvector2 *)0x0;
    }
    else {
      local_58 = that->m_lightmaps + base;
    }
    this->m_lightmaps = local_58;
    if (that->m_colors == (fcolor *)0x0) {
      local_60 = (fcolor *)0x0;
    }
    else {
      local_60 = that->m_colors + base;
    }
    this->m_colors = local_60;
    if (that->m_influences == (finfluence *)0x0) {
      local_68 = (finfluence *)0x0;
    }
    else {
      local_68 = that->m_influences + base;
    }
    this->m_influences = local_68;
    make_signature(this);
    return;
  }
  __assert_fail("base + n <= that.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                ,0x39,"void xray_re::xr_vbuf::proxy(const xr_vbuf &, size_t, size_t)");
}

Assistant:

void xr_vbuf::proxy(const xr_vbuf& that, size_t base, size_t n)
{
	xr_assert(base + n <= that.size());
	clear();
	set_owner(false);
	set_size(n);
	m_points = that.m_points ? that.m_points + base : 0;
	m_normals = that.m_normals ? that.m_normals + base : 0;
	m_texcoords = that.m_texcoords ? that.m_texcoords + base : 0;
	m_lightmaps = that.m_lightmaps ? that.m_lightmaps + base : 0;
	m_colors = that.m_colors ? that.m_colors + base : 0;
	m_influences = that.m_influences ? that.m_influences + base : 0;
	make_signature();
}